

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void outputVector<double>(vector<double,_std::allocator<double>_> *vector,string *filename)

{
  pointer pdVar1;
  ulong uVar2;
  ofstream stream;
  long local_218;
  filebuf local_210 [240];
  ios_base local_120 [264];
  
  std::ofstream::ofstream(&local_218);
  std::ofstream::open((string *)&local_218,(_Ios_Openmode)filename);
  pdVar1 = (vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar1) {
    uVar2 = 0;
    do {
      std::ostream::_M_insert<double>(pdVar1[uVar2]);
      std::ios::widen((char)*(undefined8 *)(local_218 + -0x18) + (char)&local_218);
      std::ostream::put((char)&local_218);
      std::ostream::flush();
      uVar2 = uVar2 + 1;
      pdVar1 = (vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(vector->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3));
  }
  std::ofstream::close();
  local_218 = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = _error_with_option_name;
  std::filebuf::~filebuf(local_210);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void outputVector(const std::vector<T> &vector, std::string filename){
    std::ofstream stream;
    stream.open(filename, std::ios::out);
    for(int i=0;i<vector.size();i++){
        stream<<vector[i];
        stream<<std::endl;
    }
    stream.close();
}